

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O0

void restore_attrib(void)

{
  char cVar1;
  schar sVar2;
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    if (((u.atemp.a[local_c] != '\0') && (u.atime.a[local_c] != '\0')) &&
       (cVar1 = u.atime.a[local_c] + -1, u.atime.a[local_c] = cVar1, cVar1 == '\0')) {
      cVar1 = '\x01';
      if ('\0' < u.atemp.a[local_c]) {
        cVar1 = -1;
      }
      u.atemp.a[local_c] = u.atemp.a[local_c] + cVar1;
      if (u.atemp.a[local_c] != '\0') {
        sVar2 = acurr(4);
        u.atime.a[local_c] = (schar)(100 / (long)(int)sVar2);
      }
    }
  }
  encumber_msg();
  return;
}

Assistant:

void restore_attrib(void)
{
	int	i;

	for (i = 0; i < A_MAX; i++) {	/* all temporary losses/gains */

	   if (ATEMP(i) && ATIME(i)) {
		if (!(--(ATIME(i)))) { /* countdown for change */
		    ATEMP(i) += ATEMP(i) > 0 ? -1 : 1;

		    if (ATEMP(i)) /* reset timer */
			ATIME(i) = 100 / ACURR(A_CON);
		}
	    }
	}
	encumber_msg();
}